

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscr_storage_map_based.cpp
# Opt level: O0

void __thiscall
so_5::impl::map_based_subscr_storage::storage_t::drop_subscription_for_all_states
          (storage_t *this,mbox_t *mbox,type_index *msg_type)

{
  bool bVar1;
  int iVar2;
  abstract_message_box_t *paVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Self __position;
  agent_t *paVar4;
  undefined1 auStack_70 [7];
  bool events_found;
  anon_class_24_3_586eed86 need_erase;
  key_t local_50;
  _Rb_tree_iterator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>
  local_38;
  iterator lower_bound;
  is_same_mbox_msg is_same;
  type_index *msg_type_local;
  mbox_t *mbox_local;
  storage_t *this_local;
  
  paVar3 = intrusive_ptr_t<so_5::abstract_message_box_t>::operator->(mbox);
  iVar2 = (*paVar3->_vptr_abstract_message_box_t[2])();
  lower_bound._M_node = (_Base_ptr)CONCAT44(extraout_var,iVar2);
  paVar3 = intrusive_ptr_t<so_5::abstract_message_box_t>::operator->(mbox);
  iVar2 = (*paVar3->_vptr_abstract_message_box_t[2])();
  need_erase.is_same = (is_same_mbox_msg *)msg_type->_M_target;
  key_t::key_t(&local_50,CONCAT44(extraout_var_00,iVar2),(type_index)need_erase.is_same,
               (state_t *)0x0);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t,_std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,_std::allocator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>_>
       ::lower_bound(&this->m_events,&local_50);
  _auStack_70 = &local_38;
  need_erase.this = (storage_t *)&lower_bound;
  need_erase.lower_bound = (iterator *)this;
  bVar1 = drop_subscription_for_all_states::anon_class_24_3_586eed86::operator()
                    ((anon_class_24_3_586eed86 *)auStack_70);
  if (bVar1) {
    do {
      __position = std::
                   _Rb_tree_iterator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>
                   ::operator++(&local_38,0);
      std::
      map<so_5::impl::map_based_subscr_storage::storage_t::key_t,so_5::impl::map_based_subscr_storage::storage_t::value_t,std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,std::allocator<std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>>>
      ::erase_abi_cxx11_((map<so_5::impl::map_based_subscr_storage::storage_t::key_t,so_5::impl::map_based_subscr_storage::storage_t::value_t,std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,std::allocator<std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>>>
                          *)&this->m_events,(iterator)__position._M_node);
      bVar1 = drop_subscription_for_all_states::anon_class_24_3_586eed86::operator()
                        ((anon_class_24_3_586eed86 *)auStack_70);
    } while (bVar1);
    paVar3 = intrusive_ptr_t<so_5::abstract_message_box_t>::operator->(mbox);
    paVar4 = subscription_storage_t::owner(&this->super_subscription_storage_t);
    (*paVar3->_vptr_abstract_message_box_t[4])(paVar3,msg_type,paVar4);
  }
  return;
}

Assistant:

void
storage_t::drop_subscription_for_all_states(
	const mbox_t & mbox,
	const std::type_index & msg_type )
	{
		const is_same_mbox_msg is_same{ mbox->id(), msg_type };

		auto lower_bound = m_events.lower_bound(
				key_t{ mbox->id(), msg_type, nullptr } );

		auto need_erase = [&] {
				return lower_bound != std::end(m_events) &&
						is_same( lower_bound->first );
			};
		const bool events_found = need_erase();

		if( events_found )
			{
				do
					{
						m_events.erase( lower_bound++ );
					}
				while( need_erase() );

				// Note: since v.5.5.9 mbox unsubscription is initiated even if
				// it is MPSC mboxes. It is important for the case of message
				// delivery tracing.

				mbox->unsubscribe_event_handlers( msg_type, owner() );
			}
	}